

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBCellFlag.cpp
# Opt level: O2

void __thiscall amrex::EBCellFlagFab::EBCellFlagFab(EBCellFlagFab *this,Box *b,int n,Arena *ar)

{
  _Rb_tree_header *p_Var1;
  
  BaseFab<amrex::EBCellFlag>::BaseFab(&this->super_BaseFab<amrex::EBCellFlag>,b,n,ar);
  (this->super_BaseFab<amrex::EBCellFlag>)._vptr_BaseFab =
       (_func_int **)&PTR__EBCellFlagFab_007d3100;
  *(undefined4 *)&(this->super_BaseFab<amrex::EBCellFlag>).field_0x44 = 100;
  p_Var1 = &(this->m_typemap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_typemap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_typemap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_typemap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_typemap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_typemap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

EBCellFlagFab::EBCellFlagFab (const Box& b, int n, Arena* ar)
    : BaseFab<EBCellFlag>(b,n,ar)
{}